

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O3

bool __thiscall
RuntimeObjectSystem::TestBuildCallback(RuntimeObjectSystem *this,char *file,TestBuildResult type)

{
  undefined8 *puVar1;
  char *pcVar2;
  ICompilerLogger *pIVar3;
  
  switch(type) {
  case TESTBUILDRRESULT_SUCCESS:
    pIVar3 = this->m_pCompilerLogger;
    if (pIVar3 == (ICompilerLogger *)0x0) {
      return true;
    }
    (**(code **)(*(long *)pIVar3 + 0x10))(pIVar3,"TESTBUILDRRESULT_SUCCESS: %s\n",file);
    return true;
  case TESTBUILDRRESULT_NO_FILES_TO_BUILD:
    pIVar3 = this->m_pCompilerLogger;
    if (pIVar3 == (ICompilerLogger *)0x0) {
      return true;
    }
    (**(code **)(*(long *)pIVar3 + 8))(pIVar3,"TESTBUILDRRESULT_NO_FILES_TO_BUILD\n");
    return true;
  case TESTBUILDRRESULT_BUILD_FILE_GONE:
    pIVar3 = this->m_pCompilerLogger;
    if (pIVar3 == (ICompilerLogger *)0x0) {
      return true;
    }
    puVar1 = *(undefined8 **)pIVar3;
    pcVar2 = "TESTBUILDRRESULT_BUILD_FILE_GONE: %s\n";
    break;
  case TESTBUILDRRESULT_BUILD_NOT_STARTED:
    pIVar3 = this->m_pCompilerLogger;
    if (pIVar3 == (ICompilerLogger *)0x0) {
      return true;
    }
    puVar1 = *(undefined8 **)pIVar3;
    pcVar2 = "TESTBUILDRRESULT_BUILD_NOT_STARTED: %s\n";
    break;
  case TESTBUILDRRESULT_BUILD_FAILED:
    pIVar3 = this->m_pCompilerLogger;
    if (pIVar3 == (ICompilerLogger *)0x0) {
      return true;
    }
    puVar1 = *(undefined8 **)pIVar3;
    pcVar2 = "TESTBUILDRRESULT_BUILD_FAILED: %s\n";
    break;
  case TESTBUILDRRESULT_OBJECT_SWAP_FAIL:
    pIVar3 = this->m_pCompilerLogger;
    if (pIVar3 == (ICompilerLogger *)0x0) {
      return true;
    }
    puVar1 = *(undefined8 **)pIVar3;
    pcVar2 = "TESTBUILDRRESULT_OBJECT_SWAP_FAIL: %s\n";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/RuntimeObjectSystem.cpp"
                  ,0x375,
                  "virtual bool RuntimeObjectSystem::TestBuildCallback(const char *, TestBuildResult)"
                 );
  }
  (*(code *)*puVar1)(pIVar3,pcVar2,file);
  return true;
}

Assistant:

bool RuntimeObjectSystem::TestBuildCallback(const char* file, TestBuildResult type)
{
    switch( type )
    {
    case TESTBUILDRRESULT_SUCCESS:            // SUCCESS, yay!
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("TESTBUILDRRESULT_SUCCESS: %s\n", file); }
        break;
    case TESTBUILDRRESULT_NO_FILES_TO_BUILD:  // file registration error or no runtime files of this type
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogWarning("TESTBUILDRRESULT_NO_FILES_TO_BUILD\n"); }
        break;
    case TESTBUILDRRESULT_BUILD_FILE_GONE:    // the file is no longer present
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_BUILD_FILE_GONE: %s\n", file); }
        break;
    case TESTBUILDRRESULT_BUILD_NOT_STARTED:  // file change detection could be broken, or if an include may not be included anywhere
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_BUILD_NOT_STARTED: %s\n", file); }
        break;
    case TESTBUILDRRESULT_BUILD_FAILED:       // a build was started, but it failed or module failed to load. See log.
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_BUILD_FAILED: %s\n", file); }
        break;
    case TESTBUILDRRESULT_OBJECT_SWAP_FAIL:   // build succeeded, module loaded but errors on swapping
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("TESTBUILDRRESULT_OBJECT_SWAP_FAIL: %s\n", file); }
        break;
    default:
        assert(false);
        break;
    }
    return true;
}